

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1560.c
# Opt level: O0

int scopeid(void)

{
  undefined8 local_20;
  char *url;
  CURLUcode rc;
  int error;
  CURLU *u;
  
  _rc = curl_url();
  url._4_4_ = 0;
  url._0_4_ = curl_url_set(_rc,0,"https://[fe80::20c:29ff:fe9c:409b%25eth0]/hello.html");
  if ((int)url != 0) {
    curl_mfprintf(_stderr,"%s:%d curl_url_set returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3b1,(int)url);
    url._4_4_ = url._4_4_ + 1;
  }
  url._0_4_ = curl_url_get(_rc,5,&local_20,0);
  if ((int)url == 0) {
    curl_mprintf("we got %s\n",local_20);
    curl_free(local_20);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_HOST returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3b8,(int)url);
    url._4_4_ = url._4_4_ + 1;
  }
  url._0_4_ = curl_url_set(_rc,5,"[::1]",0);
  if ((int)url != 0) {
    curl_mfprintf(_stderr,"%s:%d curl_url_set CURLUPART_HOST returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3c3,(int)url);
    url._4_4_ = url._4_4_ + 1;
  }
  url._0_4_ = curl_url_get(_rc,0,&local_20);
  if ((int)url == 0) {
    curl_mprintf("we got %s\n",local_20);
    curl_free(local_20);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_URL returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3ca,(int)url);
    url._4_4_ = url._4_4_ + 1;
  }
  url._0_4_ = curl_url_set(_rc,5,"example.com",0);
  if ((int)url != 0) {
    curl_mfprintf(_stderr,"%s:%d curl_url_set CURLUPART_HOST returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3d5,(int)url);
    url._4_4_ = url._4_4_ + 1;
  }
  url._0_4_ = curl_url_get(_rc,0,&local_20);
  if ((int)url == 0) {
    curl_mprintf("we got %s\n",local_20);
    curl_free(local_20);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_URL returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3dc,(int)url);
    url._4_4_ = url._4_4_ + 1;
  }
  url._0_4_ = curl_url_set(_rc,5,"[fe80::20c:29ff:fe9c:409b%25eth0]",0);
  if ((int)url != 0) {
    curl_mfprintf(_stderr,"%s:%d curl_url_set CURLUPART_HOST returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,1000,(int)url);
    url._4_4_ = url._4_4_ + 1;
  }
  url._0_4_ = curl_url_get(_rc,0,&local_20);
  if ((int)url == 0) {
    curl_mprintf("we got %s\n",local_20);
    curl_free(local_20);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_URL returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3ef,(int)url);
    url._4_4_ = url._4_4_ + 1;
  }
  url._0_4_ = curl_url_get(_rc,5,&local_20,0);
  if ((int)url == 0) {
    curl_mprintf("we got %s\n",local_20);
    curl_free(local_20);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_HOST returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x3fa,(int)url);
    url._4_4_ = url._4_4_ + 1;
  }
  url._0_4_ = curl_url_get(_rc,10,&local_20,0);
  if ((int)url == 0) {
    curl_mprintf("we got %s\n",local_20);
    curl_free(local_20);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_ZONEID returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x405,(int)url);
    url._4_4_ = url._4_4_ + 1;
  }
  url._0_4_ = curl_url_set(_rc,10,"clown",0);
  if ((int)url != 0) {
    curl_mfprintf(_stderr,"%s:%d curl_url_set CURLUPART_ZONEID returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x410,(int)url);
    url._4_4_ = url._4_4_ + 1;
  }
  url._0_4_ = curl_url_get(_rc,0,&local_20);
  if ((int)url == 0) {
    curl_mprintf("we got %s\n",local_20);
    curl_free(local_20);
  }
  else {
    curl_mfprintf(_stderr,"%s:%d curl_url_get CURLUPART_URL returned %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                  ,0x417,(int)url);
    url._4_4_ = url._4_4_ + 1;
  }
  curl_url_cleanup(_rc);
  return url._4_4_;
}

Assistant:

static int scopeid(void)
{
  CURLU *u = curl_url();
  int error = 0;
  CURLUcode rc;
  char *url;

  rc = curl_url_set(u, CURLUPART_URL,
                    "https://[fe80::20c:29ff:fe9c:409b%25eth0]/hello.html", 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_set returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }

  rc = curl_url_get(u, CURLUPART_HOST, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_HOST returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_set(u, CURLUPART_HOST, "[::1]", 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_set CURLUPART_HOST returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }

  rc = curl_url_get(u, CURLUPART_URL, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_URL returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_set(u, CURLUPART_HOST, "example.com", 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_set CURLUPART_HOST returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }

  rc = curl_url_get(u, CURLUPART_URL, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_URL returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_set(u, CURLUPART_HOST,
                    "[fe80::20c:29ff:fe9c:409b%25eth0]", 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_set CURLUPART_HOST returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }

  rc = curl_url_get(u, CURLUPART_URL, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_URL returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_get(u, CURLUPART_HOST, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_HOST returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_get(u, CURLUPART_ZONEID, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_ZONEID returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  rc = curl_url_set(u, CURLUPART_ZONEID, "clown", 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_set CURLUPART_ZONEID returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }

  rc = curl_url_get(u, CURLUPART_URL, &url, 0);
  if(rc != CURLUE_OK) {
    fprintf(stderr, "%s:%d curl_url_get CURLUPART_URL returned %d\n",
            __FILE__, __LINE__, (int)rc);
    error++;
  }
  else {
    printf("we got %s\n", url);
    curl_free(url);
  }

  curl_url_cleanup(u);

  return error;
}